

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringDatatypeValidator.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::StringDatatypeValidator::assignAdditionalFacet
          (StringDatatypeValidator *this,XMLCh *key,XMLCh *value,MemoryManager *manager)

{
  byte *pbVar1;
  bool bVar2;
  InvalidDatatypeFacetException *this_00;
  short sVar3;
  
  bVar2 = XMLString::equals(key,(XMLCh *)SchemaSymbols::fgELT_WHITESPACE);
  if (!bVar2) {
    this_00 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
    InvalidDatatypeFacetException::InvalidDatatypeFacetException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/StringDatatypeValidator.cpp"
               ,0x6a,FACET_Invalid_Tag,key,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,manager);
LAB_002f3bb5:
    __cxa_throw(this_00,&InvalidDatatypeFacetException::typeinfo,XMLException::~XMLException);
  }
  bVar2 = XMLString::equals(value,(XMLCh *)SchemaSymbols::fgWS_PRESERVE);
  if (bVar2) {
    sVar3 = 0;
  }
  else {
    bVar2 = XMLString::equals(value,(XMLCh *)SchemaSymbols::fgWS_REPLACE);
    sVar3 = 1;
    if (!bVar2) {
      bVar2 = XMLString::equals(value,(XMLCh *)SchemaSymbols::fgWS_COLLAPSE);
      sVar3 = 2;
      if (!bVar2) {
        this_00 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/StringDatatypeValidator.cpp"
                   ,0x60,FACET_Invalid_WS,value,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,manager);
        goto LAB_002f3bb5;
      }
    }
  }
  (this->super_AbstractStringValidator).super_DatatypeValidator.fWhiteSpace = sVar3;
  pbVar1 = (byte *)((long)&(this->super_AbstractStringValidator).super_DatatypeValidator.
                           fFacetsDefined + 1);
  *pbVar1 = *pbVar1 | 0x40;
  return;
}

Assistant:

void StringDatatypeValidator::assignAdditionalFacet(const XMLCh* const key
                                                  , const XMLCh* const value
                                                  , MemoryManager* const manager)
{
    if (XMLString::equals(key, SchemaSymbols::fgELT_WHITESPACE))
    {
        // whiteSpace = preserve | replace | collapse
        if (XMLString::equals(value, SchemaSymbols::fgWS_PRESERVE))
            setWhiteSpace(DatatypeValidator::PRESERVE);
        else if (XMLString::equals(value, SchemaSymbols::fgWS_REPLACE))
            setWhiteSpace(DatatypeValidator::REPLACE);
        else if (XMLString::equals(value, SchemaSymbols::fgWS_COLLAPSE))
            setWhiteSpace(DatatypeValidator::COLLAPSE);
        else
            ThrowXMLwithMemMgr1(InvalidDatatypeFacetException, XMLExcepts::FACET_Invalid_WS, value, manager);
        //("whiteSpace value '" + ws + "' must be one of 'preserve', 'replace', 'collapse'.");

        setFacetsDefined(DatatypeValidator::FACET_WHITESPACE);
    }
    else
    {
        ThrowXMLwithMemMgr1(InvalidDatatypeFacetException
                , XMLExcepts::FACET_Invalid_Tag
                , key
                , manager);
    }
}